

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

bool __thiscall
CivetWebSocketHandler::handleData
          (CivetWebSocketHandler *this,CivetServer *server,mg_connection *conn,int bits,char *data,
          size_t data_len)

{
  size_t data_len_local;
  char *data_local;
  int bits_local;
  mg_connection *conn_local;
  CivetServer *server_local;
  CivetWebSocketHandler *this_local;
  
  return true;
}

Assistant:

bool
CivetWebSocketHandler::handleData(CivetServer *server,
                                  struct mg_connection *conn,
                                  int bits,
                                  char *data,
                                  size_t data_len)
{
	UNUSED_PARAMETER(server);
	UNUSED_PARAMETER(conn);
	UNUSED_PARAMETER(bits);
	UNUSED_PARAMETER(data);
	UNUSED_PARAMETER(data_len);
	return true;
}